

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

bool __thiscall Debugger::DoEval(Debugger *this,shared_ptr<EvalContext> *evalContext)

{
  uint uVar1;
  element_type *peVar2;
  pointer pcVar3;
  Arena<Variable> *this_00;
  uint __val;
  dll_lua_getfield p_Var4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Debugger *L;
  long *plVar10;
  Variable *pVVar11;
  char *pcVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  Debugger *this_01;
  uint __len;
  int iVar16;
  Idx<Variable> id;
  Idx<Variable> variable;
  Idx<Variable> variable_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string statement;
  long *local_500;
  long local_4f8;
  long local_4f0;
  long lStack_4e8;
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  undefined1 local_480 [1104];
  
  L = (Debugger *)this->currentL;
  if ((L == (Debugger *)0x0) ||
     (peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar2 == (element_type *)0x0)) {
    return false;
  }
  iVar8 = peVar2->stackLevel;
  do {
    iVar9 = iVar8;
    if (L == (Debugger *)0x0) {
      L = (Debugger *)0x0;
      break;
    }
    iVar16 = -1;
    do {
      iVar16 = iVar16 + 1;
      iVar7 = (*lua_getstack)((lua_State *)L,iVar16,
                              (lua_Debug *)&((anon_union_1104_4_d2669683_for_u *)local_480)->ar51);
    } while (iVar7 != 0);
    if (iVar8 - iVar16 != 0 && iVar16 <= iVar8) {
      L = (Debugger *)ExtensionPoint::QueryParentThread(&this->manager->extension,(lua_State *)L);
      iVar9 = iVar8 - iVar16;
    }
    bVar6 = iVar16 < iVar8;
    iVar8 = iVar9;
  } while (bVar6);
  if (L == (Debugger *)0x0) {
    return false;
  }
  if (0 < ((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          cacheId) {
    (*lua_getfield)((lua_State *)L,LUA_REGISTRYINDEX,"_emmy_cache_table_");
    iVar8 = (*lua_type)((lua_State *)L,-1);
    p_Var4 = lua_getfield;
    if (iVar8 == 5) {
      uVar1 = ((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              cacheId;
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar13 = (uint)uVar15;
          if (uVar13 < 100) {
            __len = __len - 2;
            goto LAB_00147809;
          }
          if (uVar13 < 1000) {
            __len = __len - 1;
            goto LAB_00147809;
          }
          if (uVar13 < 10000) goto LAB_00147809;
          uVar15 = uVar15 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar13);
        __len = __len + 1;
      }
LAB_00147809:
      local_480._0_8_ = &(((anon_union_1104_4_d2669683_for_u *)local_480)->ar51).namewhat;
      std::__cxx11::string::_M_construct((ulong)local_480,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_480._0_8_ + (ulong)(uVar1 >> 0x1f)),__len,__val);
      (*p_Var4)((lua_State *)L,-1,(char *)local_480._0_8_);
      if ((char **)local_480._0_8_ !=
          &(((anon_union_1104_4_d2669683_for_u *)local_480)->ar51).namewhat) {
        operator_delete((void *)local_480._0_8_);
      }
      peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this->arenaRef = (peVar2->result)._arena;
      variable_00._4_4_ = 0;
      variable_00.Raw = (peVar2->result).Raw;
      variable_00._arena = (peVar2->result)._arena;
      GetVariable(this,(lua_State *)L,variable_00,-1,peVar2->depth,true);
      this->arenaRef = (Arena<Variable> *)0x0;
      (*lua_settop)((lua_State *)L,-3);
      return true;
    }
    (*lua_settop)((lua_State *)L,-2);
  }
  local_480._0_8_ = &(((anon_union_1104_4_d2669683_for_u *)local_480)->ar51).namewhat;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"return ","");
  peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->setValue == true) {
    pcVar3 = (peVar2->expr)._M_dataplus._M_p;
    local_4e0[0] = local_4d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4e0,pcVar3,pcVar3 + (peVar2->expr)._M_string_length);
    std::__cxx11::string::append((char *)local_4e0);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_4e0,
                                 (ulong)(((evalContext->
                                          super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->value)._M_dataplus._M_p);
    local_500 = &local_4f0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_4f0 = *plVar14;
      lStack_4e8 = plVar10[3];
    }
    else {
      local_4f0 = *plVar14;
      local_500 = (long *)*plVar10;
    }
    local_4f8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_500);
    local_4c0 = &local_4b0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_4b0 = *plVar14;
      lStack_4a8 = plVar10[3];
    }
    else {
      local_4b0 = *plVar14;
      local_4c0 = (long *)*plVar10;
    }
    local_4b8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_4c0,
                                 (ulong)(((evalContext->
                                          super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->expr)._M_dataplus._M_p);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_490 = *plVar14;
      lStack_488 = plVar10[3];
      local_4a0 = &local_490;
    }
    else {
      local_490 = *plVar14;
      local_4a0 = (long *)*plVar10;
    }
    local_498 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&((anon_union_1104_4_d2669683_for_u *)local_480)->ar51,(string *)&local_4a0
              );
    if (local_4a0 != &local_490) {
      operator_delete(local_4a0);
    }
    if (local_4c0 != &local_4b0) {
      operator_delete(local_4c0);
    }
    if (local_500 != &local_4f0) {
      operator_delete(local_500);
    }
    if (local_4e0[0] != local_4d0) {
      operator_delete(local_4e0[0]);
    }
  }
  else {
    std::__cxx11::string::_M_append((char *)local_480,(ulong)(peVar2->expr)._M_dataplus._M_p);
  }
  iVar8 = (*luaL_loadstring)((lua_State *)L,(char *)local_480._0_8_);
  if (iVar8 == 3) {
    peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar2->error,0,(char *)(peVar2->error)._M_string_length,0x16830c);
    peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_append((char *)&peVar2->error,(ulong)(peVar2->expr)._M_dataplus._M_p);
  }
  else {
    this_01 = L;
    iVar8 = (*lua_gettop)((lua_State *)L);
    bVar6 = CreateEnv(this_01,(lua_State *)L,iVar9);
    if (bVar6) {
      lua_setfenv((lua_State *)L,iVar8);
      iVar9 = (*lua_gettop)((lua_State *)L);
      if (iVar9 != iVar8) {
        __assert_fail("lua_gettop(L) == fIdx",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                      ,0x3d4,"bool Debugger::DoEval(std::shared_ptr<EvalContext>)");
      }
      iVar8 = lua_pcall((lua_State *)L,0,1,0);
      if (iVar8 == 2) {
        pcVar12 = (*lua_tolstring)((lua_State *)L,-1,(size_t *)0x0);
        std::__cxx11::string::operator=
                  ((string *)
                   &((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->error,pcVar12);
      }
      else if (iVar8 == 0) {
        peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (peVar2->result)._arena;
        id._4_4_ = 0;
        id.Raw = (peVar2->result).Raw;
        id._arena = this_00;
        pVVar11 = Arena<Variable>::Index(this_00,id);
        std::__cxx11::string::_M_assign((string *)&pVVar11->name);
        peVar2 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this->arenaRef = (peVar2->result)._arena;
        variable._4_4_ = 0;
        variable.Raw = (peVar2->result).Raw;
        variable._arena = (peVar2->result)._arena;
        GetVariable(this,(lua_State *)L,variable,-1,peVar2->depth,true);
        this->arenaRef = (Arena<Variable> *)0x0;
        bVar6 = true;
        (*lua_settop)((lua_State *)L,-2);
        goto LAB_001477e5;
      }
      (*lua_settop)((lua_State *)L,-2);
    }
  }
  bVar6 = false;
LAB_001477e5:
  if ((char **)local_480._0_8_ != &(((anon_union_1104_4_d2669683_for_u *)local_480)->ar51).namewhat)
  {
    operator_delete((void *)local_480._0_8_);
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool Debugger::DoEval(std::shared_ptr<EvalContext> evalContext) {
	if (!currentL || !evalContext) {
		return false;
	}

	auto L = currentL;

	int innerLevel = evalContext->stackLevel;

	while (L != nullptr) {
		int level = LastLevel(L);
		if (innerLevel > level) {
			innerLevel -= level;
			L = manager->extension.QueryParentThread(L);
		} else {
			break;
		}
	}

	if (L == nullptr) {
		return false;
	}

	//auto* const L = L;
	// From "cacheId"
	if (evalContext->cacheId > 0) {
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_type(L, -1) == LUA_TTABLE) {
			lua_getfield(L, -1, std::to_string(evalContext->cacheId).c_str());// 1: cacheTable, 2: value
			SetVariableArena(evalContext->result.GetArena());
			GetVariable(L, evalContext->result, -1, evalContext->depth);
			ClearVariableArenaRef();
			lua_pop(L, 2);
			return true;
		}
		lua_pop(L, 1);
	}
	// LOAD AS "return expr"
	std::string statement = "return ";
	if (evalContext->setValue) {
		statement = evalContext->expr + " = " + evalContext->value + " return " + evalContext->expr;
	} else {
		statement.append(evalContext->expr);
	}

	// 如果是 aaa:bbbb 则纠正为aaa.bbbb
	int r = luaL_loadstring(L, statement.c_str());
	if (r == LUA_ERRSYNTAX) {
		evalContext->error = "syntax err: ";
		evalContext->error.append(evalContext->expr);
		return false;
	}
	// call
	const int fIdx = lua_gettop(L);
	// create env
	if (!CreateEnv(L, innerLevel))
		return false;
	// setup env
#ifndef EMMY_USE_LUA_SOURCE
	lua_setfenv(L, fIdx);
#elif defined(EMMY_LUA_51) || defined(EMMY_LUA_JIT)
    lua_setfenv(L, fIdx);
#else //52 & 53
    lua_setupvalue(L, fIdx, 1);
#endif
	assert(lua_gettop(L) == fIdx);
	// call function() return expr end
	r = lua_pcall(L, 0, 1, 0);
	if (r == LUA_OK) {
		evalContext->result->name = evalContext->expr;
		SetVariableArena(evalContext->result.GetArena());
		GetVariable(L, evalContext->result, -1, evalContext->depth);
		ClearVariableArenaRef();
		lua_pop(L, 1);
		return true;
	}
	if (r == LUA_ERRRUN) {
		evalContext->error = lua_tostring(L, -1);
	}

	lua_pop(L, 1);
	return false;
}